

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_argv.cpp
# Opt level: O1

char * __thiscall DArgs::CheckValue(DArgs *this,char *check)

{
  char cVar1;
  FString *pFVar2;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar8 = (ulong)(this->Argv).Count;
  uVar6 = 0;
  if (1 < uVar8) {
    pFVar2 = (this->Argv).Array;
    uVar7 = 1;
    do {
      iVar4 = strcasecmp(check,pFVar2[uVar7].Chars);
      if (iVar4 == 0) {
        uVar6 = (uint)uVar7;
        break;
      }
      uVar7 = uVar7 + 1;
    } while (uVar8 != uVar7);
  }
  if (((int)uVar6 < 1) || ((int)((this->Argv).Count - 1) <= (int)uVar6)) {
    pcVar5 = (char *)0x0;
  }
  else {
    pcVar3 = (this->Argv).Array[(ulong)uVar6 + 1].Chars;
    cVar1 = *pcVar3;
    pcVar5 = (char *)0x0;
    if ((cVar1 != '+') && (cVar1 != '-')) {
      pcVar5 = pcVar3;
    }
  }
  return pcVar5;
}

Assistant:

const char *DArgs::CheckValue(const char *check) const
{
	int i = CheckParm(check);

	if (i > 0 && i < (int)Argv.Size() - 1)
	{
		i++;
		return Argv[i][0] != '+' && Argv[i][0] != '-' ? Argv[i].GetChars() : NULL;
	}
	else
	{
		return NULL;
	}
}